

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

void __thiscall ncnn::Mat::to_pixels(Mat *this,uchar *pixels,int type,int stride)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int remain_1;
  int iVar6;
  uchar *puVar7;
  uchar uVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  Mat local_70;
  
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      iVar10 = this->w;
      local_70.h = this->h;
      iVar3 = iVar10 * -3 + stride;
      iVar6 = local_70.h * iVar10;
      iVar2 = 0;
      iVar5 = 0;
      if (0 < local_70.h) {
        iVar5 = local_70.h;
      }
      pfVar1 = (float *)this->data;
      local_70.elemsize = this->elemsize;
      local_70.elempack = this->elempack;
      local_70.allocator = this->allocator;
      local_70.refcount = (int *)0x0;
      local_70.dims = 2;
      local_70.c = 1;
      local_70.cstep = (size_t)iVar6;
      local_70.data = pfVar1;
      local_70.w = iVar10;
      ~Mat(&local_70);
      channel(&local_70,this,1);
      pfVar13 = (float *)local_70.data;
      ~Mat(&local_70);
      channel(&local_70,this,2);
      pfVar11 = (float *)local_70.data;
      ~Mat(&local_70);
      if (iVar3 != 0) {
        iVar6 = iVar10;
      }
      if (iVar3 == 0) {
        iVar5 = 1;
      }
      puVar7 = pixels;
      for (iVar10 = 0; iVar4 = iVar6, iVar10 != iVar5; iVar10 = iVar10 + 1) {
        for (; 0 < iVar4; iVar4 = iVar4 + -1) {
          iVar9 = (int)*pfVar1;
          if ((int)*pfVar1 < 1) {
            iVar9 = iVar2;
          }
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          *puVar7 = (uchar)iVar9;
          iVar9 = (int)*pfVar13;
          if ((int)*pfVar13 < 1) {
            iVar9 = iVar2;
          }
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          puVar7[1] = (uchar)iVar9;
          iVar9 = (int)*pfVar11;
          if ((int)*pfVar11 < 1) {
            iVar9 = iVar2;
          }
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          puVar7[2] = (uchar)iVar9;
          puVar7 = puVar7 + 3;
          pfVar1 = pfVar1 + 1;
          pfVar13 = pfVar13 + 1;
          pfVar11 = pfVar11 + 1;
        }
        puVar7 = puVar7 + iVar3;
      }
    }
    if ((short)type != 4) {
      if ((type & 0xffffU) != 3) {
        return;
      }
      iVar10 = this->w;
      iVar5 = this->h;
      iVar6 = 0;
      if (0 < iVar5) {
        iVar6 = iVar5;
      }
      iVar3 = stride - iVar10;
      iVar2 = 1;
      if (iVar3 == 0) {
        iVar6 = iVar2;
        iVar2 = iVar5;
      }
      pfVar1 = (float *)this->data;
      for (iVar5 = 0; iVar4 = iVar2 * iVar10, iVar5 != iVar6; iVar5 = iVar5 + 1) {
        for (; 0 < iVar4; iVar4 = iVar4 + -1) {
          iVar9 = (int)*pfVar1;
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          *pixels = (uchar)iVar9;
          pixels = pixels + 1;
          pfVar1 = pfVar1 + 1;
        }
        pixels = pixels + iVar3;
      }
      return;
    }
    iVar10 = this->w;
    local_70.h = this->h;
    iVar5 = local_70.h * iVar10;
    iVar2 = 0;
    iVar6 = 0;
    if (0 < local_70.h) {
      iVar6 = local_70.h;
    }
    pfVar1 = (float *)this->data;
    local_70.elemsize = this->elemsize;
    local_70.elempack = this->elempack;
    local_70.allocator = this->allocator;
    local_70.refcount = (int *)0x0;
    local_70.dims = 2;
    local_70.c = 1;
    local_70.cstep = (size_t)iVar5;
    local_70.data = pfVar1;
    local_70.w = iVar10;
    ~Mat(&local_70);
    channel(&local_70,this,1);
    pfVar13 = (float *)local_70.data;
    ~Mat(&local_70);
    channel(&local_70,this,2);
    pfVar11 = (float *)local_70.data;
    ~Mat(&local_70);
    channel(&local_70,this,3);
    pfVar12 = (float *)local_70.data;
    ~Mat(&local_70);
    iVar3 = stride + iVar10 * -4;
    if (iVar3 != 0) {
      iVar5 = iVar10;
    }
    if (iVar3 == 0) {
      iVar6 = 1;
    }
    for (iVar10 = 0; iVar4 = iVar5, iVar10 != iVar6; iVar10 = iVar10 + 1) {
      for (; 0 < iVar4; iVar4 = iVar4 + -1) {
        iVar9 = (int)*pfVar1;
        if ((int)*pfVar1 < 1) {
          iVar9 = iVar2;
        }
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        *pixels = (uchar)iVar9;
        iVar9 = (int)*pfVar13;
        if ((int)*pfVar13 < 1) {
          iVar9 = iVar2;
        }
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        pixels[1] = (uchar)iVar9;
        iVar9 = (int)*pfVar11;
        if ((int)*pfVar11 < 1) {
          iVar9 = iVar2;
        }
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        pixels[2] = (uchar)iVar9;
        iVar9 = (int)*pfVar12;
        if ((int)*pfVar12 < 1) {
          iVar9 = iVar2;
        }
        if (0xfe < iVar9) {
          iVar9 = 0xff;
        }
        pixels[3] = (uchar)iVar9;
        pixels = pixels + 4;
        pfVar1 = pfVar1 + 1;
        pfVar13 = pfVar13 + 1;
        pfVar11 = pfVar11 + 1;
        pfVar12 = pfVar12 + 1;
      }
      pixels = pixels + iVar3;
    }
    return;
  }
  if (type != 0x10002) {
    if (type == 0x40003) {
      iVar10 = this->w;
      iVar5 = this->h;
      iVar6 = 0;
      if (0 < iVar5) {
        iVar6 = iVar5;
      }
      iVar3 = stride + iVar10 * -4;
      iVar2 = 1;
      if (iVar3 == 0) {
        iVar6 = iVar2;
        iVar2 = iVar5;
      }
      pfVar1 = (float *)this->data;
      for (iVar5 = 0; iVar4 = iVar2 * iVar10, iVar5 != iVar6; iVar5 = iVar5 + 1) {
        for (; 0 < iVar4; iVar4 = iVar4 + -1) {
          iVar9 = (int)*pfVar1;
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
          uVar8 = (uchar)iVar9;
          *pixels = uVar8;
          pixels[1] = uVar8;
          pixels[2] = uVar8;
          pixels[3] = 0xff;
          pixels = pixels + 4;
          pfVar1 = pfVar1 + 1;
        }
        pixels = pixels + iVar3;
      }
      return;
    }
    if (type == 0x40001) {
      iVar10 = this->w;
      local_70.h = this->h;
      iVar6 = local_70.h * iVar10;
      iVar5 = 0;
      if (0 < local_70.h) {
        iVar5 = local_70.h;
      }
      pfVar1 = (float *)this->data;
      local_70.elemsize = this->elemsize;
      local_70.elempack = this->elempack;
      local_70.allocator = this->allocator;
      local_70.refcount = (int *)0x0;
      local_70.dims = 2;
      local_70.c = 1;
      local_70.cstep = (size_t)iVar6;
      local_70.data = pfVar1;
      local_70.w = iVar10;
      ~Mat(&local_70);
      channel(&local_70,this,1);
      pfVar13 = (float *)local_70.data;
      ~Mat(&local_70);
      channel(&local_70,this,2);
      pfVar11 = (float *)local_70.data;
      ~Mat(&local_70);
      iVar2 = stride + iVar10 * -4;
      if (iVar2 != 0) {
        iVar6 = iVar10;
      }
      if (iVar2 == 0) {
        iVar5 = 1;
      }
      for (iVar10 = 0; iVar3 = iVar6, iVar10 != iVar5; iVar10 = iVar10 + 1) {
        for (; 0 < iVar3; iVar3 = iVar3 + -1) {
          iVar4 = (int)*pfVar1;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          *pixels = (uchar)iVar4;
          iVar4 = (int)*pfVar13;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          pixels[1] = (uchar)iVar4;
          iVar4 = (int)*pfVar11;
          if ((int)*pfVar11 < 1) {
            iVar4 = 0;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          pixels[2] = (uchar)iVar4;
          pixels[3] = 0xff;
          pixels = pixels + 4;
          pfVar1 = pfVar1 + 1;
          pfVar13 = pfVar13 + 1;
          pfVar11 = pfVar11 + 1;
        }
        pixels = pixels + iVar2;
      }
      return;
    }
    if (type == 0x40002) {
      iVar10 = this->w;
      local_70.h = this->h;
      iVar6 = local_70.h * iVar10;
      iVar5 = 0;
      if (0 < local_70.h) {
        iVar5 = local_70.h;
      }
      pfVar1 = (float *)this->data;
      local_70.elemsize = this->elemsize;
      local_70.elempack = this->elempack;
      local_70.allocator = this->allocator;
      local_70.refcount = (int *)0x0;
      local_70.dims = 2;
      local_70.c = 1;
      local_70.cstep = (size_t)iVar6;
      local_70.data = pfVar1;
      local_70.w = iVar10;
      ~Mat(&local_70);
      channel(&local_70,this,1);
      pfVar13 = (float *)local_70.data;
      ~Mat(&local_70);
      channel(&local_70,this,2);
      pfVar11 = (float *)local_70.data;
      ~Mat(&local_70);
      iVar2 = stride + iVar10 * -4;
      if (iVar2 != 0) {
        iVar6 = iVar10;
      }
      if (iVar2 == 0) {
        iVar5 = 1;
      }
      for (iVar10 = 0; iVar3 = iVar6, iVar10 != iVar5; iVar10 = iVar10 + 1) {
        for (; 0 < iVar3; iVar3 = iVar3 + -1) {
          iVar4 = (int)*pfVar11;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          *pixels = (uchar)iVar4;
          iVar4 = (int)*pfVar13;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          pixels[1] = (uchar)iVar4;
          iVar4 = (int)*pfVar1;
          if ((int)*pfVar1 < 1) {
            iVar4 = 0;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          pixels[2] = (uchar)iVar4;
          pixels[3] = 0xff;
          pixels = pixels + 4;
          pfVar1 = pfVar1 + 1;
          pfVar13 = pfVar13 + 1;
          pfVar11 = pfVar11 + 1;
        }
        pixels = pixels + iVar2;
      }
      return;
    }
    if (type != 0x20001) {
      return;
    }
  }
  iVar10 = this->w;
  local_70.h = this->h;
  iVar2 = iVar10 * -3 + stride;
  iVar6 = local_70.h * iVar10;
  iVar3 = 0;
  iVar5 = 0;
  if (0 < local_70.h) {
    iVar5 = local_70.h;
  }
  pfVar1 = (float *)this->data;
  local_70.elemsize = this->elemsize;
  local_70.elempack = this->elempack;
  local_70.allocator = this->allocator;
  local_70.refcount = (int *)0x0;
  local_70.dims = 2;
  local_70.c = 1;
  local_70.cstep = (size_t)iVar6;
  local_70.data = pfVar1;
  local_70.w = iVar10;
  ~Mat(&local_70);
  channel(&local_70,this,1);
  pfVar13 = (float *)local_70.data;
  ~Mat(&local_70);
  channel(&local_70,this,2);
  pfVar11 = (float *)local_70.data;
  ~Mat(&local_70);
  if (iVar2 != 0) {
    iVar6 = iVar10;
  }
  if (iVar2 == 0) {
    iVar5 = 1;
  }
  for (iVar10 = 0; iVar4 = iVar6, iVar10 != iVar5; iVar10 = iVar10 + 1) {
    for (; 0 < iVar4; iVar4 = iVar4 + -1) {
      iVar9 = (int)*pfVar1;
      if ((int)*pfVar1 < 1) {
        iVar9 = iVar3;
      }
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      pixels[2] = (uchar)iVar9;
      iVar9 = (int)*pfVar13;
      if ((int)*pfVar13 < 1) {
        iVar9 = iVar3;
      }
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      pixels[1] = (uchar)iVar9;
      iVar9 = (int)*pfVar11;
      if ((int)*pfVar11 < 1) {
        iVar9 = iVar3;
      }
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      *pixels = (uchar)iVar9;
      pixels = pixels + 3;
      pfVar1 = pfVar1 + 1;
      pfVar13 = pfVar13 + 1;
      pfVar11 = pfVar11 + 1;
    }
    pixels = pixels + iVar2;
  }
  return;
}

Assistant:

void Mat::to_pixels(unsigned char* pixels, int type, int stride) const
{
    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            to_bgr2rgb(*this, pixels, stride);
            break;
        case PIXEL_RGB2RGBA:
            to_rgb2rgba(*this, pixels, stride);
            break;
        case PIXEL_BGR2RGBA:
            to_bgr2rgba(*this, pixels, stride);
            break;
        case PIXEL_GRAY2RGBA:
            to_gray2rgba(*this, pixels, stride);
            break;
        default:
            // unimplemented convert type
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            to_rgb(*this, pixels, stride);

        if (type == PIXEL_GRAY)
            to_gray(*this, pixels, stride);

        if (type == PIXEL_RGBA)
            to_rgba(*this, pixels, stride);
    }
}